

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

int setupServer(Address *address)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  in_addr_t iVar4;
  char *pcVar5;
  uint *puVar6;
  sockaddr *psVar7;
  sockaddr_in server_addr;
  sockaddr sStack_50;
  Address *pAStack_40;
  sockaddr local_28;
  
  uVar2 = socket(2,1,0);
  if (uVar2 == 0xffffffff) {
    puts("socket creation failed...");
    exit(-1);
  }
  printf("\x1b[32m[+] Socket successfully created.\n\x1b[0m");
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  uVar1 = (ushort)address->port;
  local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  local_28.sa_family = 2;
  local_28.sa_data._2_4_ = 0;
  pcVar5 = (char *)(ulong)uVar2;
  iVar3 = bind(uVar2,&local_28,0x10);
  if (iVar3 == 0) {
    pcVar5 = (char *)(ulong)uVar2;
    iVar3 = listen(uVar2,10);
    if (iVar3 == 0) {
      printf("\x1b[32m[+] Server listening on %s:%d\x1b[0m\n",address,(ulong)(uint)address->port);
      return uVar2;
    }
  }
  else {
    setupServer_cold_1();
  }
  setupServer_cold_2();
  psVar7 = &sStack_50;
  puVar6 = (uint *)0x1;
  pAStack_40 = address;
  uVar2 = socket(2,1,0);
  if (uVar2 == 0xffffffff) {
    pcVar5 = "socket()";
    perror_die("socket()");
  }
  else {
    printf("\x1b[32m[+] Socket successfully created.\n\x1b[0m");
    sStack_50.sa_data[6] = '\0';
    sStack_50.sa_data[7] = '\0';
    sStack_50.sa_data[8] = '\0';
    sStack_50.sa_data[9] = '\0';
    sStack_50.sa_data[10] = '\0';
    sStack_50.sa_data[0xb] = '\0';
    sStack_50.sa_data[0xc] = '\0';
    sStack_50.sa_data[0xd] = '\0';
    sStack_50.sa_family = 2;
    sStack_50.sa_data[0] = '\0';
    sStack_50.sa_data[1] = '\0';
    sStack_50.sa_data[2] = '\0';
    sStack_50.sa_data[3] = '\0';
    sStack_50.sa_data[4] = '\0';
    sStack_50.sa_data[5] = '\0';
    iVar4 = inet_addr(pcVar5);
    sStack_50.sa_data._0_2_ = *(ushort *)(pcVar5 + 0x10) << 8 | *(ushort *)(pcVar5 + 0x10) >> 8;
    sStack_50.sa_data._2_4_ = iVar4;
    pcVar5 = (char *)(ulong)uVar2;
    iVar3 = connect(uVar2,&sStack_50,0x10);
    puVar6 = (uint *)psVar7;
    if (iVar3 == 0) {
      printf("\x1b[32m[+] Connected to the server.\n\x1b[0m");
      return uVar2;
    }
  }
  setupClient_cold_1();
  if (*(int *)pcVar5 - 1U < 0x11) {
    pcVar5 = &DAT_00105078 + *(int *)(&DAT_00105078 + (ulong)(*(int *)pcVar5 - 1U) * 4);
  }
  else {
    pcVar5 = "INIT";
  }
  iVar3 = printf("\x1b[90mTHREAD #%d: state: %s\x1b[0m\n",(ulong)*puVar6,pcVar5);
  return iVar3;
}

Assistant:

int 
setupServer(Address* address)
{
    /* 
     * socket() -> bind() -> listen() [-> accept()]
     *                                      ^-------- out of the scope of this function. comes later.
     */

    int sockfd;          // listening socket file descriptor
    int ret;

    struct sockaddr_in server_addr;     // server address
    

    // socket create and verification
    sockfd = socket(AF_INET, SOCK_STREAM, 0);   // create socket and check return value
    if (sockfd == -1) {
        printf("socket creation failed...\n");
        exit(-1);
    }
    else {
        printf(ANSI_COLOR_GREEN "[+] Socket successfully created.\n" ANSI_COLOR_RESET);
    }
    memset(&server_addr, '\0', sizeof(server_addr));

    // assign ip and port
    server_addr.sin_family = AF_INET;
    server_addr.sin_addr.s_addr = htonl(INADDR_ANY);    // connect to any
    server_addr.sin_port = htons(address->port);        // port number

    // Binding newly created socket to given IP and verification

    ret = (bind(sockfd, (struct sockaddr*) &server_addr, sizeof(server_addr)));
    if (ret != 0) {
        perror_die("socket bind failed...\n");
    }

    // else
    //     printf("Socket successfully binded..\n");

    // Now server is ready to listen and verification
    ret = listen(sockfd, BACKLOG);
    if (ret != 0) {
        perror_die("Listen()");
    }
    else
        printf(ANSI_COLOR_GREEN "[+] Server listening on %s:%d" ANSI_COLOR_RESET "\n", address->ip, address->port);

    return sockfd;
}